

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O2

double RDL_countPaths(uint a,uint b,uint V,RDL_sPathInfo *spi)

{
  uint *puVar1;
  uint uVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  RDL_graph *pRVar6;
  uint *puVar7;
  void *__ptr;
  uint *indegree;
  uint *__ptr_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar9 = (ulong)V;
  __ptr = malloc(uVar9 * 8);
  indegree = (uint *)malloc(uVar9 * 4);
  __ptr_00 = (uint *)malloc(uVar9 * 4);
  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    *(undefined8 *)((long)__ptr + uVar8 * 8) = 0;
    indegree[uVar8] = 0xffffffff;
  }
  RDL_findIndegree(a,b,indegree,spi);
  uVar10 = 0;
  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    if (indegree[uVar8] == 0) {
      __ptr_00[uVar10] = (uint)uVar8;
      uVar10 = (ulong)((int)uVar10 + 1);
      *(undefined8 *)((long)__ptr + uVar8 * 8) = 0x3ff0000000000000;
    }
  }
  if (((int)uVar10 == 1) && (*__ptr_00 == b)) {
    pRVar6 = spi->dPaths[a];
    puVar7 = pRVar6->degree;
    uVar8 = 1;
    while ((int)uVar8 != 0) {
      uVar8 = (ulong)((int)uVar8 - 1);
      uVar9 = (ulong)__ptr_00[uVar8];
      uVar4 = puVar7[uVar9];
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        uVar5 = pRVar6->adjList[uVar9][uVar10][0];
        uVar11 = (ulong)uVar5;
        puVar1 = indegree + uVar11;
        *puVar1 = *puVar1 - 1;
        uVar2 = *puVar1;
        *(double *)((long)__ptr + uVar11 * 8) =
             *(double *)((long)__ptr + uVar9 * 8) + *(double *)((long)__ptr + uVar11 * 8);
        if (uVar2 == 0) {
          __ptr_00[uVar8] = uVar5;
          uVar8 = (ulong)((int)uVar8 + 1);
        }
      }
    }
    dVar3 = *(double *)((long)__ptr + (ulong)a * 8);
    free(__ptr);
    free(indegree);
    free(__ptr_00);
    return dVar3;
  }
  (*RDL_outputFunc)(RDL_ERROR,"invalid topological sort!");
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                ,0x5c,
                "double RDL_countPaths(unsigned int, unsigned int, unsigned int, const RDL_sPathInfo *)"
               );
}

Assistant:

double RDL_countPaths(unsigned a, unsigned b,
    unsigned V, const RDL_sPathInfo *spi)
{
  unsigned i, curr, vertex, empty_end=0;
  unsigned *indegree, *empty_set;
  double *nof_paths, result;

  nof_paths = malloc(V * sizeof(*nof_paths));
  indegree = malloc(V * sizeof(*indegree));
  empty_set = malloc(V * sizeof(*empty_set));
  for (i = 0; i < V; ++i) {
    nof_paths[i] = 0.0;
    indegree[i] = UINT_MAX;
  }

  RDL_findIndegree(a, b, indegree, spi);

  for (i = 0; i < V; ++i) {
    if (indegree[i] == 0) {
      empty_set[empty_end] = i;
      ++empty_end;
      nof_paths[i] = 1.0;
    }
  }

  if (empty_end != 1 || empty_set[0] != b) {
    RDL_outputFunc(RDL_ERROR, "invalid topological sort!");
    /* should never happen */
    assert(0);
    free(nof_paths);
    free(indegree);
    free(empty_set);
    return DBL_MAX;
  }

  /* look at the nodes in an topological sort */
  while (empty_end) {
    curr = empty_set[empty_end-1];
    --empty_end;
    for(i=0; i<spi->dPaths[a]->degree[curr]; ++i) {
      vertex = spi->dPaths[a]->adjList[curr][i][0];
      --indegree[vertex];
      nof_paths[vertex] += nof_paths[curr];
      if (!indegree[vertex]) {
        empty_set[empty_end] = vertex;
        ++empty_end;
      }
    }
  }

  result = nof_paths[a];

  free(nof_paths);
  free(indegree);
  free(empty_set);

  return result;
}